

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

string * __thiscall
ArgsManager::GetHelpMessage_abi_cxx11_(string *__return_storage_ptr__,ArgsManager *this)

{
  optional<bool> oVar1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_color _Var4;
  _Rb_tree_header *p_Var5;
  byte bVar6;
  long in_FS_OFFSET;
  string *usage;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  string name;
  unique_lock<std::recursive_mutex> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-help-debug","");
  oVar1 = GetBoolArg(this,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_a8._M_owns = false;
  local_a8._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&local_a8);
  p_Var3 = (this->m_available_args)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->m_available_args)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    bVar6 = oVar1.super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool>._M_engaged &
            oVar1.super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool>._M_payload & 1;
    do {
      _Var4 = p_Var3[1]._M_color;
      switch(_Var4) {
      case _S_red:
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Options:","");
        HelpMessageGroup(&local_58,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      case _S_black:
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"Connection options:","");
        HelpMessageGroup(&local_58,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      case 2:
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Wallet options:","");
        HelpMessageGroup(&local_58,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      case 3:
        if (bVar6 != 0) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"Wallet debugging/testing options:","");
          HelpMessageGroup(&local_58,&local_78);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
          break;
        }
        goto LAB_00d1e4e7;
      case 4:
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"ZeroMQ notification options:","");
        HelpMessageGroup(&local_58,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      case 5:
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"Debugging/Testing options:","");
        HelpMessageGroup(&local_58,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      case 6:
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"Chain selection options:","");
        HelpMessageGroup(&local_58,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      case 7:
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"Node relay options:","");
        HelpMessageGroup(&local_58,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      case 8:
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"Block creation options:","");
        HelpMessageGroup(&local_58,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      case 9:
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"RPC server options:","");
        HelpMessageGroup(&local_58,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      case 10:
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"UI Options:","");
        HelpMessageGroup(&local_58,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      case 0xb:
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Commands:","");
        HelpMessageGroup(&local_58,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      case 0xc:
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Register Commands:","")
        ;
        HelpMessageGroup(&local_58,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      case 0xd:
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CLI Commands:","");
        HelpMessageGroup(&local_58,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      case 0xe:
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"IPC interprocess connection options:","");
        HelpMessageGroup(&local_58,&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      default:
        goto switchD_00d1e00f_default;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      _Var4 = p_Var3[1]._M_color;
switchD_00d1e00f_default:
      if (_Var4 == 0xf) break;
LAB_00d1e4e7:
      for (p_Var2 = *(_Rb_tree_node_base **)(p_Var3 + 2);
          p_Var2 != (_Rb_tree_node_base *)&p_Var3[1]._M_left;
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
        if ((bVar6 != 0) || ((p_Var2[4]._M_color & 0x100) == _S_red)) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          if (p_Var2[2]._M_parent == (_Base_ptr)0x0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign(&local_58,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (p_Var2 + 1));
          }
          else {
            std::operator+(&local_98,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var2 + 1),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var2 + 2));
            GetHelpMessage_abi_cxx11_();
          }
          HelpMessageOpt(&local_78,&local_58,(string *)(p_Var2 + 3));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,local_78._M_dataplus._M_p,local_78._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ArgsManager::GetHelpMessage() const
{
    const bool show_debug = GetBoolArg("-help-debug", false);

    std::string usage;
    LOCK(cs_args);
    for (const auto& arg_map : m_available_args) {
        switch(arg_map.first) {
            case OptionsCategory::OPTIONS:
                usage += HelpMessageGroup("Options:");
                break;
            case OptionsCategory::CONNECTION:
                usage += HelpMessageGroup("Connection options:");
                break;
            case OptionsCategory::ZMQ:
                usage += HelpMessageGroup("ZeroMQ notification options:");
                break;
            case OptionsCategory::DEBUG_TEST:
                usage += HelpMessageGroup("Debugging/Testing options:");
                break;
            case OptionsCategory::NODE_RELAY:
                usage += HelpMessageGroup("Node relay options:");
                break;
            case OptionsCategory::BLOCK_CREATION:
                usage += HelpMessageGroup("Block creation options:");
                break;
            case OptionsCategory::RPC:
                usage += HelpMessageGroup("RPC server options:");
                break;
            case OptionsCategory::IPC:
                usage += HelpMessageGroup("IPC interprocess connection options:");
                break;
            case OptionsCategory::WALLET:
                usage += HelpMessageGroup("Wallet options:");
                break;
            case OptionsCategory::WALLET_DEBUG_TEST:
                if (show_debug) usage += HelpMessageGroup("Wallet debugging/testing options:");
                break;
            case OptionsCategory::CHAINPARAMS:
                usage += HelpMessageGroup("Chain selection options:");
                break;
            case OptionsCategory::GUI:
                usage += HelpMessageGroup("UI Options:");
                break;
            case OptionsCategory::COMMANDS:
                usage += HelpMessageGroup("Commands:");
                break;
            case OptionsCategory::REGISTER_COMMANDS:
                usage += HelpMessageGroup("Register Commands:");
                break;
            case OptionsCategory::CLI_COMMANDS:
                usage += HelpMessageGroup("CLI Commands:");
                break;
            default:
                break;
        }

        // When we get to the hidden options, stop
        if (arg_map.first == OptionsCategory::HIDDEN) break;

        for (const auto& arg : arg_map.second) {
            if (show_debug || !(arg.second.m_flags & ArgsManager::DEBUG_ONLY)) {
                std::string name;
                if (arg.second.m_help_param.empty()) {
                    name = arg.first;
                } else {
                    name = arg.first + arg.second.m_help_param;
                }
                usage += HelpMessageOpt(name, arg.second.m_help_text);
            }
        }
    }
    return usage;
}